

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.h
# Opt level: O0

void __thiscall UnitTest::UnitTester::runTestInt(UnitTester *this,TestFunction fun,char *name)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  UnitTestFailure anon_var_0;
  exception *e;
  char *name_local;
  TestFunction fun_local;
  UnitTester *this_local;
  
  if ((global_unit_test_object_._24_8_ == 0) ||
     (iVar1 = strcmp(name,(char *)global_unit_test_object_._24_8_), iVar1 == 0)) {
    global_unit_test_object_[0] = 1;
    global_unit_test_object_[1] = 0;
    setFuzzyness<float>(1.0);
    setFuzzyness<double>(1.0);
    (*fun)();
    if ((global_unit_test_object_[1] & 1) == 0) {
      if ((global_unit_test_object_[0] & 1) == 0) {
        pcVar3 = _unittest_fail();
        std::operator<<((ostream *)&std::cout,pcVar3);
        if ((this->vim_lines & 1U) == 0) {
          std::operator<<((ostream *)&std::cout,anon_var_dwarf_2795);
        }
        poVar2 = std::operator<<((ostream *)&std::cout,name);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        if ((this->vim_lines & 1U) != 0) {
          std::operator<<((ostream *)&std::cout,'\n');
        }
        this->failedTests = this->failedTests + 1;
      }
      else {
        printPass();
        std::operator<<((ostream *)&std::cout,name);
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        this->passedTests = this->passedTests + 1;
      }
    }
    else if ((global_unit_test_object_[0] & 1) == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"XFAIL: ");
      poVar2 = std::operator<<(poVar2,name);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"unexpected PASS: ");
      poVar2 = std::operator<<(poVar2,name);
      poVar2 = std::operator<<(poVar2,
                               "\n    This test should have failed but didn\'t. Check the code!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      this->failedTests = this->failedTests + 1;
    }
  }
  return;
}

Assistant:

void UnitTester::runTestInt(TestFunction fun, const char *name) {  // {{{1
  if (global_unit_test_object_.only_name &&
      0 != std::strcmp(name, global_unit_test_object_.only_name)) {
    return;
  }
  global_unit_test_object_.status = true;
  global_unit_test_object_.expect_failure = false;
  try {
    setFuzzyness<float>(1);
    setFuzzyness<double>(1);
    fun();
  }
  catch (UnitTestFailure) {
  }
  catch (std::exception &e) {
    std::cout << _unittest_fail() << "┍ " << name
              << " threw an unexpected exception:\n";
    std::cout << _unittest_fail() << "│ " << e.what() << '\n';
    global_unit_test_object_.status = false;
  }
  catch (...) {
    std::cout << _unittest_fail() << "┍ " << name
              << " threw an unexpected exception, of unknown type\n";
    global_unit_test_object_.status = false;
  }
  if (global_unit_test_object_.expect_failure) {
    if (!global_unit_test_object_.status) {
      std::cout << "XFAIL: " << name << std::endl;
    } else {
      std::cout
          << "unexpected PASS: " << name
          << "\n    This test should have failed but didn't. Check the code!"
          << std::endl;
      ++failedTests;
    }
  } else {
    if (!global_unit_test_object_.status) {
      std::cout << _unittest_fail();
      if (!vim_lines) {
        std::cout << "┕ ";
      }
      std::cout << name << std::endl;
      if (vim_lines) {
        std::cout << '\n';
      }
      ++failedTests;
    } else {
      UnitTest::printPass();
      std::cout << name;
      std::cout << std::endl;
      ++passedTests;
    }
  }
}